

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O0

LispPTR N_OP_lsh(LispPTR a,LispPTR b)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  int *NAddr;
  byte bVar3;
  int *fixpp;
  int size;
  int arg2;
  int arg;
  LispPTR b_local;
  LispPTR a_local;
  
  if ((b & 0xfff0000) == 0xe0000) {
    fixpp._0_4_ = b & 0xffff;
  }
  else if ((b & 0xfff0000) == 0xf0000) {
    fixpp._0_4_ = b | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (b >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = b;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(b);
    fixpp._0_4_ = *pLVar2;
  }
  if ((a & 0xfff0000) == 0xe0000) {
    fixpp._4_4_ = a & 0xffff;
  }
  else if ((a & 0xfff0000) == 0xf0000) {
    fixpp._4_4_ = a | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (a >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = b;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(a);
    fixpp._4_4_ = *pLVar2;
  }
  bVar3 = (byte)(uint)fixpp;
  if ((int)(uint)fixpp < 1) {
    if (-1 < (int)(uint)fixpp) {
      return a;
    }
    if (-0x20 < (int)(uint)fixpp) {
      size = (int)fixpp._4_4_ >> (-bVar3 & 0x1f);
      goto LAB_001543a8;
    }
  }
  else if (((int)(uint)fixpp < 0x20) &&
          (size = fixpp._4_4_ << (bVar3 & 0x1f), size >> (bVar3 & 0x1f) == fixpp._4_4_)) {
LAB_001543a8:
    if ((uint)size >> 0x10 == 0xffff) {
      return size & 0xffffU | 0xf0000;
    }
    if ((uint)size >> 0x10 != 0) {
      NAddr = (int *)createcell68k(2);
      *NAddr = size;
      LVar1 = LAddrFromNative(NAddr);
      return LVar1;
    }
    return size | 0xe0000;
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = b;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_lsh(LispPTR a, LispPTR b) {
  int arg, arg2;
  int size;
  /*DLword	*wordp;*/

  N_GETNUMBER(b, size, do_ufn);
  N_GETNUMBER(a, arg2, do_ufn);

  if (size > 0) {
    if (size > 31) goto do_ufn;
    arg = arg2 << size;
    if ((arg >> size) != arg2) goto do_ufn;
  } else if (size < 0) {
    if (size < -31) goto do_ufn;
    arg = arg2 >> -size;
    /*** Commented out JDS 1/27/89:  This punts if you shifted ***/
    /*** ANY 1 bits off the right edge.  You CAN'T overflow    ***/
    /*** in this direction!!                                   ***/
    /*		if ((arg << -size) != arg2) goto do_ufn; */
  } else
    return (a);

  N_ARITH_SWITCH(arg);

do_ufn:
  ERROR_EXIT(b);
}